

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

string * player_not_found_message_abi_cxx11_(string *__return_storage_ptr__,string_view name)

{
  undefined1 local_20 [8];
  string_view name_local;
  string *result;
  
  name_local._M_len = (size_t)name._M_str;
  local_20 = (undefined1  [8])name._M_len;
  name_local._M_str = (char *)__return_storage_ptr__;
  s_abi_cxx11_(__return_storage_ptr__,"Error: Player \"",0xf);
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)local_20);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,"\" not found.");
  return __return_storage_ptr__;
}

Assistant:

std::string player_not_found_message(std::string_view name) {
	std::string result = "Error: Player \""s;
	result += name;
	result += "\" not found.";
	return result;
}